

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_base.cpp
# Opt level: O1

ssize_t __thiscall ximu::ReaderBase::read(ReaderBase *this,int __fd,void *__buf,size_t __nbytes)

{
  ulong uVar1;
  iterator *piVar2;
  _Elt_pointer puVar3;
  _Elt_pointer puVar4;
  _Elt_pointer puVar5;
  iterator *extraout_RAX;
  iterator *piVar6;
  ulong uVar7;
  long lVar8;
  _Elt_pointer puVar9;
  _Elt_pointer puVar10;
  _Elt_pointer puVar11;
  _Elt_pointer puVar12;
  _Elt_pointer puVar13;
  _Elt_pointer puVar14;
  _Elt_pointer puVar15;
  _Elt_pointer puVar16;
  _Elt_pointer puVar17;
  iterator *piVar18;
  iterator *piVar19;
  iterator local_f0;
  _Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> local_d0;
  _Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> local_b0;
  _Elt_pointer local_90;
  _Elt_pointer local_88;
  iterator local_80;
  iterator local_60;
  deque<unsigned_char,_std::allocator<unsigned_char>_> *local_40;
  _Elt_pointer local_38;
  
  local_40 = &this->_buffer;
  do {
    piVar2 = (iterator *)
             (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node;
    piVar6 = (iterator *)
             (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Deque_impl_data._M_start._M_node;
    puVar17 = (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    puVar3 = (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_first;
    puVar4 = (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur;
    puVar5 = (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Deque_impl_data._M_start._M_last;
    puVar9 = puVar5 + (long)(puVar17 +
                            (((((ulong)((long)piVar2 - (long)piVar6) >> 3) -
                              (ulong)(piVar2 != (iterator *)0x0)) * 0x200 - (long)puVar3) -
                            (long)puVar4));
    if (puVar9 < (_Elt_pointer)0x5) {
      return (ssize_t)piVar6;
    }
    local_90 = (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Deque_impl_data._M_start._M_first;
    local_88 = (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_last;
    puVar10 = puVar5;
    puVar12 = local_90;
    puVar15 = puVar4;
    piVar18 = piVar6;
    if (0 < (long)puVar9 >> 2) {
      lVar8 = ((long)puVar9 >> 2) + 1;
      do {
        puVar11 = puVar10;
        puVar13 = puVar12;
        puVar14 = puVar15;
        piVar19 = piVar18;
        if ((char)*puVar15 < '\0') goto LAB_0010632e;
        puVar14 = puVar15 + 1;
        if (puVar15 + 1 == puVar10) {
          puVar12 = piVar18->_M_first;
          piVar18 = (iterator *)&piVar18->_M_first;
          puVar10 = puVar12 + 0x200;
          puVar14 = puVar12;
        }
        puVar11 = puVar10;
        puVar13 = puVar12;
        piVar19 = piVar18;
        if ((char)*puVar14 < '\0') goto LAB_0010632e;
        puVar15 = puVar14 + 1;
        if (puVar14 + 1 == puVar10) {
          puVar12 = piVar18->_M_first;
          piVar18 = (iterator *)&piVar18->_M_first;
          puVar10 = puVar12 + 0x200;
          puVar15 = puVar12;
        }
        puVar11 = puVar10;
        puVar13 = puVar12;
        puVar14 = puVar15;
        piVar19 = piVar18;
        if ((char)*puVar15 < '\0') goto LAB_0010632e;
        puVar14 = puVar15 + 1;
        if (puVar15 + 1 == puVar10) {
          puVar12 = piVar18->_M_first;
          piVar18 = (iterator *)&piVar18->_M_first;
          puVar10 = puVar12 + 0x200;
          puVar14 = puVar12;
        }
        puVar11 = puVar10;
        puVar13 = puVar12;
        piVar19 = piVar18;
        if ((char)*puVar14 < '\0') goto LAB_0010632e;
        puVar15 = puVar14 + 1;
        if (puVar14 + 1 == puVar10) {
          puVar12 = piVar18->_M_first;
          piVar18 = (iterator *)&piVar18->_M_first;
          puVar10 = puVar12 + 0x200;
          puVar15 = puVar12;
        }
        lVar8 = lVar8 + -1;
      } while (1 < lVar8);
    }
    puVar16 = puVar10 + (long)(puVar17 +
                              (((ulong)((long)piVar2 - (long)piVar18) >> 3) -
                              (ulong)(piVar2 != (iterator *)0x0)) * 0x200 +
                              (-(long)puVar15 - (long)puVar3));
    if (puVar16 == (_Elt_pointer)0x1) {
LAB_00106314:
      puVar11 = local_88;
      puVar13 = puVar3;
      puVar14 = puVar17;
      piVar19 = piVar2;
      if ((char)*puVar15 < '\0') {
        puVar11 = puVar10;
        puVar13 = puVar12;
        puVar14 = puVar15;
        piVar19 = piVar18;
      }
    }
    else if (puVar16 == (_Elt_pointer)0x2) {
LAB_001062ec:
      puVar11 = puVar10;
      puVar13 = puVar12;
      puVar14 = puVar15;
      piVar19 = piVar18;
      if (-1 < (char)*puVar15) {
        puVar15 = puVar15 + 1;
        if (puVar15 == puVar10) {
          puVar12 = piVar18->_M_first;
          piVar18 = (iterator *)&piVar18->_M_first;
          puVar10 = puVar12 + 0x200;
          puVar15 = puVar12;
        }
        goto LAB_00106314;
      }
    }
    else {
      puVar11 = local_88;
      puVar13 = puVar3;
      puVar14 = puVar17;
      piVar19 = piVar2;
      if ((puVar16 == (_Elt_pointer)0x3) &&
         (puVar11 = puVar10, puVar13 = puVar12, puVar14 = puVar15, piVar19 = piVar18,
         -1 < (char)*puVar15)) {
        puVar15 = puVar15 + 1;
        if (puVar15 == puVar10) {
          puVar12 = piVar18->_M_first;
          piVar18 = (iterator *)&piVar18->_M_first;
          puVar10 = puVar12 + 0x200;
          puVar15 = puVar12;
        }
        goto LAB_001062ec;
      }
    }
LAB_0010632e:
    local_38 = puVar17;
    if (puVar14 == puVar17) {
      if ((_Elt_pointer)0x1e < puVar9) {
        std::deque<unsigned_char,_std::allocator<unsigned_char>_>::clear(local_40);
        piVar6 = extraout_RAX;
      }
    }
    else {
      if (puVar5 + (long)puVar14 +
          ((((ulong)((long)piVar19 - (long)piVar6) >> 3) - 1) + (ulong)(piVar19 == (iterator *)0x0))
          * 0x200 + (-(long)puVar13 - (long)puVar4) + -0x1f < (_Elt_pointer)0xffffffffffffffe5) {
        uVar1 = ((long)puVar14 - (long)puVar13) + 1;
        if (uVar1 < 0x200) {
          local_60._M_cur = puVar14 + 1;
        }
        else {
          uVar7 = uVar1 >> 9 | 0xff80000000000000;
          if (-1 < (long)puVar14 - (long)puVar13) {
            uVar7 = uVar1 >> 9;
          }
          piVar19 = (iterator *)(&piVar19->_M_cur + uVar7);
          local_60._M_cur = piVar19->_M_cur + uVar1 + uVar7 * -0x200;
        }
        local_80._M_first = piVar6->_M_cur;
        local_60._M_first = piVar19->_M_cur;
        local_80._M_cur = puVar4;
        local_80._M_node = (_Map_pointer)piVar6;
      }
      else {
        lVar8 = (long)puVar14 - (long)puVar13;
        uVar1 = lVar8 + 1;
        if (uVar1 < 0x200) {
          local_b0._M_cur = puVar14 + 1;
          local_b0._M_first = puVar13;
          local_b0._M_last = puVar11;
          local_b0._M_node = &piVar19->_M_cur;
        }
        else {
          uVar7 = uVar1 >> 9 | 0xff80000000000000;
          if (-1 < lVar8) {
            uVar7 = uVar1 >> 9;
          }
          local_b0._M_node = &piVar19->_M_cur + uVar7;
          local_b0._M_first = ((iterator *)local_b0._M_node)->_M_cur;
          local_b0._M_last = local_b0._M_first + 0x200;
          local_b0._M_cur = local_b0._M_first + uVar1 + uVar7 * -0x200;
        }
        local_d0._M_cur = puVar4;
        local_d0._M_first = local_90;
        local_d0._M_last = puVar5;
        local_d0._M_node = (_Map_pointer)piVar6;
        PacketReader::read<std::_Deque_iterator<unsigned_char,unsigned_char&,unsigned_char*>>
                  (&this->super_PacketReader,&local_d0,&local_b0);
        if (uVar1 < 0x200) {
          local_60._M_cur = puVar14 + 1;
        }
        else {
          uVar7 = uVar1 >> 9 | 0xff80000000000000;
          if (-1 < lVar8) {
            uVar7 = uVar1 >> 9;
          }
          piVar19 = (iterator *)(&piVar19->_M_cur + uVar7);
          local_60._M_cur = piVar19->_M_cur + uVar1 + uVar7 * -0x200;
        }
        local_80._M_cur =
             (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur;
        local_80._M_node =
             (this->_buffer).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Deque_impl_data._M_start._M_node;
        local_80._M_first = ((iterator *)local_80._M_node)->_M_cur;
        local_60._M_first = piVar19->_M_cur;
      }
      puVar17 = local_38;
      local_80._M_last = local_80._M_first + 0x200;
      local_60._M_last = local_60._M_first + 0x200;
      local_60._M_node = &piVar19->_M_cur;
      piVar6 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::_M_erase
                         (&local_f0,local_40,&local_80,&local_60);
    }
    if (puVar14 == puVar17) {
      return (ssize_t)piVar6;
    }
  } while( true );
}

Assistant:

void ReaderBase::read() {
  bool done = false;

  // todo @aukedirk no-magic numbers
  while (_buffer.size() > 4 && !done) {

      // locate potential header byte
    auto frameBuffer = std::find_if(
        _buffer.begin(), _buffer.end(), isFrameBuffer);

    // we did not find the framebuffer
    if (frameBuffer == _buffer.end())
    {
        if (_buffer.size() > 30)
            _buffer.clear();
        return;
    }

    // All messages are between 4 and 30 bytes
    size_t msgLength = std::distance(_buffer.begin(),frameBuffer);
    if (msgLength < 4 || msgLength > 30)
    {
        _buffer.erase(_buffer.begin(), frameBuffer + 1);
    }
    else
    {
        //  todo @auke-dirk investigate enum
        //  pass to the packetreader
        switch (PacketReader::read(_buffer.begin(), frameBuffer + 1)) {
          case PacketReader::INVALID_CHECKSUM:
          case PacketReader::OKE:
          case PacketReader::INVALID_PACKET_SIZE:
            _buffer.erase(_buffer.begin(), frameBuffer + 1);
            break;
          default:
            _buffer.erase(_buffer.begin(), frameBuffer + 1);
        }
    }
  }
}